

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3SetHasNullFlag(Vdbe *v,int iCur,int regHasNull)

{
  int addr;
  undefined4 in_EDX;
  undefined4 in_ESI;
  Vdbe *in_RDI;
  int unaff_retaddr;
  int addr1;
  int in_stack_ffffffffffffffe8;
  int in_stack_ffffffffffffffec;
  
  sqlite3VdbeAddOp2((Vdbe *)CONCAT44(in_ESI,in_EDX),in_stack_ffffffffffffffec,
                    in_stack_ffffffffffffffe8,0);
  addr = sqlite3VdbeAddOp1((Vdbe *)CONCAT44(in_ESI,in_EDX),in_stack_ffffffffffffffec,
                           in_stack_ffffffffffffffe8);
  sqlite3VdbeAddOp3((Vdbe *)CONCAT44(iCur,regHasNull),addr1,unaff_retaddr,
                    (int)((ulong)in_RDI >> 0x20),(int)in_RDI);
  sqlite3VdbeChangeP5(in_RDI,0x80);
  sqlite3VdbeJumpHere((Vdbe *)CONCAT44(in_ESI,in_EDX),addr);
  return;
}

Assistant:

static void sqlite3SetHasNullFlag(Vdbe *v, int iCur, int regHasNull){
  int addr1;
  sqlite3VdbeAddOp2(v, OP_Integer, 0, regHasNull);
  addr1 = sqlite3VdbeAddOp1(v, OP_Rewind, iCur); VdbeCoverage(v);
  sqlite3VdbeAddOp3(v, OP_Column, iCur, 0, regHasNull);
  sqlite3VdbeChangeP5(v, OPFLAG_TYPEOFARG);
  VdbeComment((v, "first_entry_in(%d)", iCur));
  sqlite3VdbeJumpHere(v, addr1);
}